

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void CConsole::ConToggle(IResult *pResult,void *pUser)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  CChain *pChainInfo;
  undefined4 extraout_var;
  CCommand *pCVar5;
  void **ppvVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FCommandCallback *pp_Var7;
  char *format;
  long in_FS_OFFSET;
  char local_a8 [128];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8[0x70] = '\0';
  local_a8[0x71] = '\0';
  local_a8[0x72] = '\0';
  local_a8[0x73] = '\0';
  local_a8[0x74] = '\0';
  local_a8[0x75] = '\0';
  local_a8[0x76] = '\0';
  local_a8[0x77] = '\0';
  local_a8[0x78] = '\0';
  local_a8[0x79] = '\0';
  local_a8[0x7a] = '\0';
  local_a8[0x7b] = '\0';
  local_a8[0x7c] = '\0';
  local_a8[0x7d] = '\0';
  local_a8[0x7e] = '\0';
  local_a8[0x7f] = '\0';
  local_a8[0x60] = '\0';
  local_a8[0x61] = '\0';
  local_a8[0x62] = '\0';
  local_a8[99] = '\0';
  local_a8[100] = '\0';
  local_a8[0x65] = '\0';
  local_a8[0x66] = '\0';
  local_a8[0x67] = '\0';
  local_a8[0x68] = '\0';
  local_a8[0x69] = '\0';
  local_a8[0x6a] = '\0';
  local_a8[0x6b] = '\0';
  local_a8[0x6c] = '\0';
  local_a8[0x6d] = '\0';
  local_a8[0x6e] = '\0';
  local_a8[0x6f] = '\0';
  local_a8[0x50] = '\0';
  local_a8[0x51] = '\0';
  local_a8[0x52] = '\0';
  local_a8[0x53] = '\0';
  local_a8[0x54] = '\0';
  local_a8[0x55] = '\0';
  local_a8[0x56] = '\0';
  local_a8[0x57] = '\0';
  local_a8[0x58] = '\0';
  local_a8[0x59] = '\0';
  local_a8[0x5a] = '\0';
  local_a8[0x5b] = '\0';
  local_a8[0x5c] = '\0';
  local_a8[0x5d] = '\0';
  local_a8[0x5e] = '\0';
  local_a8[0x5f] = '\0';
  local_a8[0x40] = '\0';
  local_a8[0x41] = '\0';
  local_a8[0x42] = '\0';
  local_a8[0x43] = '\0';
  local_a8[0x44] = '\0';
  local_a8[0x45] = '\0';
  local_a8[0x46] = '\0';
  local_a8[0x47] = '\0';
  local_a8[0x48] = '\0';
  local_a8[0x49] = '\0';
  local_a8[0x4a] = '\0';
  local_a8[0x4b] = '\0';
  local_a8[0x4c] = '\0';
  local_a8[0x4d] = '\0';
  local_a8[0x4e] = '\0';
  local_a8[0x4f] = '\0';
  local_a8[0x30] = '\0';
  local_a8[0x31] = '\0';
  local_a8[0x32] = '\0';
  local_a8[0x33] = '\0';
  local_a8[0x34] = '\0';
  local_a8[0x35] = '\0';
  local_a8[0x36] = '\0';
  local_a8[0x37] = '\0';
  local_a8[0x38] = '\0';
  local_a8[0x39] = '\0';
  local_a8[0x3a] = '\0';
  local_a8[0x3b] = '\0';
  local_a8[0x3c] = '\0';
  local_a8[0x3d] = '\0';
  local_a8[0x3e] = '\0';
  local_a8[0x3f] = '\0';
  local_a8[0x20] = '\0';
  local_a8[0x21] = '\0';
  local_a8[0x22] = '\0';
  local_a8[0x23] = '\0';
  local_a8[0x24] = '\0';
  local_a8[0x25] = '\0';
  local_a8[0x26] = '\0';
  local_a8[0x27] = '\0';
  local_a8[0x28] = '\0';
  local_a8[0x29] = '\0';
  local_a8[0x2a] = '\0';
  local_a8[0x2b] = '\0';
  local_a8[0x2c] = '\0';
  local_a8[0x2d] = '\0';
  local_a8[0x2e] = '\0';
  local_a8[0x2f] = '\0';
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
  pCVar5 = FindCommand((CConsole *)pUser,(char *)CONCAT44(extraout_var,iVar2),
                       *(int *)((long)pUser + 0x10));
  if (pCVar5 == (CCommand *)0x0) {
    format = "No such command: \'%s\'.";
  }
  else {
    pp_Var7 = &pCVar5->m_pfnCallback;
    ppvVar6 = &pCVar5->m_pUserData;
    while( true ) {
      pvVar1 = *ppvVar6;
      if (*pp_Var7 != Con_Chain) break;
      pp_Var7 = (FCommandCallback *)((long)pvVar1 + 8);
      ppvVar6 = (void **)((long)pvVar1 + 0x10);
    }
    if (*pp_Var7 == IntVariableCommand) {
      iVar2 = **(int **)((long)pvVar1 + 8);
      iVar3 = (*pResult->_vptr_IResult[2])(pResult,1);
      uVar4 = (*pResult->_vptr_IResult[2])(pResult,(ulong)((iVar2 == iVar3) + 1));
      iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
      str_format(local_a8,0x80,"%s %i",CONCAT44(extraout_var_01,iVar2),(ulong)uVar4);
      (**(code **)(*pUser + 0x98))(pUser,local_a8);
      goto LAB_00124ca3;
    }
    format = "Invalid command: \'%s\'.";
  }
  iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
  str_format(local_a8,0x80,format,CONCAT44(extraout_var_00,iVar2));
  if (local_a8[0] != '\0') {
    (**(code **)(*pUser + 200))(pUser,0,"console",local_a8,0);
  }
LAB_00124ca3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::ConToggle(IConsole::IResult *pResult, void *pUser)
{
	CConsole *pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128] = {0};
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), pConsole->m_FlagMask);
	if(pCommand)
	{
		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		pConsole->TraverseChain(&pfnCallback, &pUserData);
		if(pfnCallback == IntVariableCommand)
		{
			CIntVariableData *pData = static_cast<CIntVariableData *>(pUserData);
			int Val = *(pData->m_pVariable)==pResult->GetInteger(1) ? pResult->GetInteger(2) : pResult->GetInteger(1);
			str_format(aBuf, sizeof(aBuf), "%s %i", pResult->GetString(0), Val);
			pConsole->ExecuteLine(aBuf);
			aBuf[0] = 0;
		}
		else
			str_format(aBuf, sizeof(aBuf), "Invalid command: '%s'.", pResult->GetString(0));
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));

	if(aBuf[0])
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}